

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall
IR::Instr::BinaryCalculatorT<long>
          (Instr *this,long src1Const,long src2Const,int64 *pResult,bool checkWouldTrap)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = false;
  bVar1 = (byte)src2Const;
  switch(this->m_opcode) {
  case Add_I4:
    uVar3 = src2Const + src1Const;
    break;
  case Sub_I4:
    uVar3 = src1Const - src2Const;
    break;
  case Mul_I4:
    uVar3 = Js::AsmJsMath::Mul<long>(src1Const,src2Const);
    break;
  case Div_I4:
    if ((checkWouldTrap) && (bVar2 = Js::AsmJsMath::DivWouldTrap<long>(src1Const,src2Const), bVar2))
    {
      return false;
    }
    uVar3 = Js::AsmJsMath::DivChecked<long>(src1Const,src2Const);
    break;
  case DivU_I4:
    if ((checkWouldTrap) &&
       (bVar2 = Js::AsmJsMath::DivWouldTrap<unsigned_long>(src1Const,src2Const), bVar2)) {
      return false;
    }
    uVar3 = Js::AsmJsMath::DivChecked<unsigned_long>(src1Const,src2Const);
    break;
  case Rem_I4:
    if ((checkWouldTrap) && (bVar2 = Js::AsmJsMath::RemWouldTrap<long>(src1Const,src2Const), bVar2))
    {
      return false;
    }
    uVar3 = Js::AsmJsMath::RemChecked<long>(src1Const,src2Const);
    break;
  case RemU_I4:
    if ((checkWouldTrap) &&
       (bVar2 = Js::AsmJsMath::RemWouldTrap<unsigned_long>(src1Const,src2Const), bVar2)) {
      return false;
    }
    uVar3 = Js::AsmJsMath::RemChecked<unsigned_long>(src1Const,src2Const);
    break;
  case And_I4:
    uVar3 = src2Const & src1Const;
    break;
  case Or_I4:
    uVar3 = src2Const | src1Const;
    break;
  case Xor_I4:
    uVar3 = src2Const ^ src1Const;
    break;
  case Shl_I4:
    uVar3 = src1Const << (bVar1 & 0x3f);
    break;
  case Shr_I4:
    uVar3 = src1Const >> (bVar1 & 0x3f);
    break;
  case ShrU_I4:
    uVar3 = (ulong)src1Const >> (bVar1 & 0x3f);
    break;
  default:
    goto switchD_004bea9e_caseD_1cd;
  case CmEq_I4:
    uVar3 = (ulong)(src1Const == src2Const);
    break;
  case CmNeq_I4:
    uVar3 = (ulong)(src1Const != src2Const);
    break;
  case CmLt_I4:
    uVar3 = (ulong)(src1Const < src2Const);
    break;
  case CmLe_I4:
    uVar3 = (ulong)(src1Const <= src2Const);
    break;
  case CmGt_I4:
    uVar3 = (ulong)(src2Const < src1Const);
    break;
  case CmGe_I4:
    uVar3 = (ulong)(src2Const <= src1Const);
    break;
  case CmUnLt_I4:
    uVar3 = (ulong)((ulong)src1Const < (ulong)src2Const);
    break;
  case CmUnLe_I4:
    uVar3 = (ulong)((ulong)src1Const <= (ulong)src2Const);
    break;
  case CmUnGt_I4:
    uVar3 = (ulong)((ulong)src2Const < (ulong)src1Const);
    break;
  case CmUnGe_I4:
    uVar3 = (ulong)((ulong)src2Const <= (ulong)src1Const);
  }
  *pResult = uVar3;
  bVar2 = true;
switchD_004bea9e_caseD_1cd:
  return bVar2;
}

Assistant:

bool Instr::BinaryCalculatorT(T src1Const, T src2Const, int64 *pResult, bool checkWouldTrap)
{
    T value = 0;
    switch (this->m_opcode)
    {
#define DO_HANDLER(HANDLER, type) HANDLER(type##src1Const, type##src2Const)
#define BINARY_CASE_CHECK(OPCODE,HANDLER,CHECK_HANDLER,type) \
    case Js::OpCode::##OPCODE: \
        if (checkWouldTrap && DO_HANDLER(CHECK_HANDLER,type)) { return false; } \
        value = DO_HANDLER(HANDLER,type); \
        break;
#define BINARY_CASE(OPCODE,HANDLER,type) \
    case Js::OpCode::##OPCODE: \
        value = DO_HANDLER(HANDLER,type); \
        break;
#define BINARY_U(OPCODE,HANDLER) BINARY_CASE(OPCODE,HANDLER,(typename SignedTypeTraits<T>::UnsignedType))
#define BINARY(OPCODE,HANDLER)  BINARY_CASE(OPCODE,HANDLER,)

        BINARY(CmEq_I4, Js::AsmJsMath::CmpEq)
        BINARY(CmNeq_I4, Js::AsmJsMath::CmpNe)
        BINARY(CmLt_I4, Js::AsmJsMath::CmpLt)
        BINARY(CmGt_I4, Js::AsmJsMath::CmpGt)
        BINARY(CmLe_I4, Js::AsmJsMath::CmpLe)
        BINARY(CmGe_I4, Js::AsmJsMath::CmpGe)
        BINARY_U(CmUnLt_I4, Js::AsmJsMath::CmpLt)
        BINARY_U(CmUnGt_I4, Js::AsmJsMath::CmpGt)
        BINARY_U(CmUnLe_I4, Js::AsmJsMath::CmpLe)
        BINARY_U(CmUnGe_I4, Js::AsmJsMath::CmpGe)
        BINARY(Add_I4, Js::AsmJsMath::Add)
        BINARY(Sub_I4, Js::AsmJsMath::Sub)
        BINARY(Mul_I4, Js::AsmJsMath::Mul)
        BINARY(And_I4, Js::AsmJsMath::And)
        BINARY(Or_I4, Js::AsmJsMath::Or)
        BINARY(Xor_I4, Js::AsmJsMath::Xor)
        BINARY(Shl_I4, Wasm::WasmMath::Shl)
        BINARY(Shr_I4, Wasm::WasmMath::Shr)
        BINARY_U(ShrU_I4, Wasm::WasmMath::ShrU)
        BINARY_CASE_CHECK(DivU_I4, Js::AsmJsMath::DivChecked, Js::AsmJsMath::DivWouldTrap, (typename SignedTypeTraits<T>::UnsignedType))
        BINARY_CASE_CHECK(Div_I4, Js::AsmJsMath::DivChecked, Js::AsmJsMath::DivWouldTrap, )
        BINARY_CASE_CHECK(RemU_I4, Js::AsmJsMath::RemChecked, Js::AsmJsMath::RemWouldTrap, (typename SignedTypeTraits<T>::UnsignedType))
        BINARY_CASE_CHECK(Rem_I4, Js::AsmJsMath::RemChecked, Js::AsmJsMath::RemWouldTrap, )
        default:
            return false;
#undef BINARY
#undef BINARY_U
    }

    *pResult = value;
    return true;
}

template bool Instr::BinaryCalculatorT<int>(int src1Const64, int src2Const64, int64 *pResult, bool checkWouldTrap);
template bool Instr::BinaryCalculatorT<int64>(int64 src1Const64, int64 src2Const64, int64 *pResult, bool checkWouldTrap);

bool Instr::BinaryCalculator(IntConstType src1Const, IntConstType src2Const, IntConstType *pResult, IRType type)
{
    IntConstType value = 0;

    switch (this->m_opcode)
    {
    case Js::OpCode::Add_A:
        if (IntConstMath::Add(src1Const, src2Const, type, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Sub_A:
        if (IntConstMath::Sub(src1Const, src2Const, type, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Mul_A:
        if (IntConstMath::Mul(src1Const, src2Const, type, &value))
        {
            return false;
        }
        if (value == 0)
        {
            // might be -0
            // Bail for now...
            return false;
        }
        break;

    case Js::OpCode::Div_A:
        if (src2Const == 0)
        {
            // Could fold to INF/-INF
            // instr->HoistSrc1(Js::OpCode::Ld_A);
            return false;
        }
        if (src1Const == 0 && src2Const < 0)
        {
            // folds to -0. Bail for now...
            return false;
        }
        if (IntConstMath::Div(src1Const, src2Const, type, &value))
        {
            return false;
        }
        if (src1Const % src2Const != 0)
        {
            // Bail for now...
            return false;
        }
        break;

    case Js::OpCode::Rem_A:

        if (src2Const == 0)
        {
            // Bail for now...
            return false;
        }
        if (IntConstMath::Mod(src1Const, src2Const, type, &value))
        {
            return false;
        }
        if (value == 0)
        {
            // might be -0
            // Bail for now...
            return false;
        }
        break;

    case Js::OpCode::Shl_A:
        // We don't care about overflow here
        value = src1Const << (src2Const & 0x1F);
        break;

    case Js::OpCode::Shr_A:
        value = src1Const >> (src2Const & 0x1F);
        break;

    case Js::OpCode::ShrU_A:
        value = ((UIntConstType)src1Const) >> (src2Const & 0x1F);
        if (value < 0)
        {
            // ShrU produces a UInt32.  If it doesn't fit in an Int32, bail as we don't
            // track signs of int values.
            return false;
        }
        break;

    case Js::OpCode::And_A:
        value = src1Const & src2Const;
        break;

    case Js::OpCode::Or_A:
        value = src1Const | src2Const;
        break;

    case Js::OpCode::Xor_A:
        value = src1Const ^ src2Const;
        break;

    case Js::OpCode::InlineMathMin:
        value = src1Const < src2Const ? src1Const : src2Const;
        break;

    case Js::OpCode::InlineMathMax:
        value = src1Const > src2Const ? src1Const : src2Const;
        break;

    default:
        return false;
    }

    *pResult = value;

    return true;
}

bool Instr::UnaryCalculator(IntConstType src1Const, IntConstType *pResult, IRType type)
{
    IntConstType value = 0;

    switch (this->m_opcode)
    {
    case Js::OpCode::Neg_A:
        if (src1Const == 0)
        {
            // Could fold to -0.0
            return false;
        }

        if (IntConstMath::Neg(src1Const, type, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Not_A:
        value = ~src1Const;
        break;

    case Js::OpCode::Ld_A:
        if (this->HasBailOutInfo())
        {
            Assert(this->GetBailOutKind() == IR::BailOutExpectingInteger);
            this->ClearBailOutInfo();
        }
        value = src1Const;
        break;

    case Js::OpCode::Conv_Num:
    case Js::OpCode::Ld_I4:
        value = src1Const;
        break;

    case Js::OpCode::Incr_A:
        if (IntConstMath::Inc(src1Const, type, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Decr_A:
        if (IntConstMath::Dec(src1Const, type, &value))
        {
            return false;
        }
        break;


    case Js::OpCode::InlineMathAbs:
        if (src1Const == IntConstMin)
        {
            return false;
        }
        else
        {
            value = src1Const < 0 ? -src1Const : src1Const;
        }
        break;

    case Js::OpCode::InlineMathClz:
        DWORD clz;
        DWORD src1Const32;
        src1Const32 = (DWORD)src1Const;
        if (_BitScanReverse(&clz, src1Const32))
        {
            value = 31 - clz;
        }
        else
        {
            value = 32;
        }
        this->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathFloor:
        value = src1Const;
        this->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathCeil:
        value = src1Const;
        this->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathRound:
        value = src1Const;
        this->ClearBailOutInfo();
        break;
    case Js::OpCode::ToVar:
        if (Js::TaggedInt::IsOverflow(src1Const))
        {
            return false;
        }
        else
        {
            value = src1Const;
            this->ClearBailOutInfo();
            break;
        }
    default:
        return false;
    }

    *pResult = value;
    return true;
}

GeneratorBailInInstr*
GeneratorBailInInstr::New(IR::Instr* yieldInstr, Func* func)
{
    GeneratorBailInInstr* labelInstr = JitAnew(func->m_alloc, IR::GeneratorBailInInstr, func->m_alloc, yieldInstr);
    labelInstr->Init(Js::OpCode::GeneratorBailInLabel, InstrKindLabel, func, false /* isOpHelper */);
    return labelInstr;
}

#if ENABLE_DEBUG_CONFIG_OPTIONS
///----------------------------------------------------------------------------
///
/// Instr::DumpTestTrace
///
///     Dump this instr in TestTrace.
///
///----------------------------------------------------------------------------

void
Instr::DumpTestTrace()
{
    Output::Print(_u("opcode: %s "), Js::OpCodeUtil::GetOpCodeName(m_opcode));
    SymOpnd * symOpnd;

    if (this->m_opcode == Js::OpCode::NewScFunc || this->m_opcode == Js::OpCode::NewScGenFunc)
    {
        Output::Print(_u("\n"));
        return;
    }
    Opnd * src1 = this->GetSrc1();
    if (!src1)
    {
        Output::Print(_u("\n"));
        return;
    }
    if (src1->GetKind() != OpndKindSym)
    {
        Output::Print(_u("\n"));
        return;
    }

    symOpnd = src1->AsSymOpnd();
    if (symOpnd->m_sym->IsPropertySym())
    {
        PropertySym *propertySym = symOpnd->m_sym->AsPropertySym();

        switch (propertySym->m_fieldKind)
        {
        case PropertyKindData:
            if (!JITManager::GetJITManager()->IsOOPJITEnabled())
            {
                Js::PropertyRecord const* fieldName = propertySym->GetFunc()->GetInProcThreadContext()->GetPropertyRecord(propertySym->m_propertyId);
                Output::Print(_u("field: %s "), fieldName->GetBuffer());
                break;
            }
            // else fall through
        case PropertyKindSlots:
            Output::Print(_u("field: [%d] "), propertySym->m_propertyId);
            break;
        case PropertyKindLocalSlots:
            Output::Print(_u("field: l[%d] "), propertySym->m_propertyId);
            break;
        default:
            break;
        }
        Output::Print(_u("\n"));
    }
}